

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O3

STPathSet * __thiscall
jbcoin::STObject::getFieldByConstRef<jbcoin::STPathSet,jbcoin::STPathSet>
          (STObject *this,SField *field,STPathSet *empty)

{
  STPathSet *pSVar1;
  int iVar2;
  
  iVar2 = getFieldIndex(this,field);
  if (iVar2 != -1) {
    pSVar1 = (STPathSet *)
             (this->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar2].p_;
    if (pSVar1 != (STPathSet *)0x0) {
      iVar2 = (*(pSVar1->super_STBase)._vptr_STBase[4])(pSVar1);
      if ((iVar2 != 0) &&
         (empty = pSVar1,
         (pSVar1->super_STBase)._vptr_STBase != (_func_int **)&PTR__STPathSet_002d3258)) {
        Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
      }
      return empty;
    }
  }
  Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
}

Assistant:

V const& getFieldByConstRef (SField const& field, V const& empty) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return empty; // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return *cf;
    }